

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

CURLcode cf_cntrl_all(connectdata *conn,Curl_easy *data,_Bool ignore_result,int event,int arg1,
                     void *arg2)

{
  CURLcode CVar1;
  long lVar2;
  
  CVar1 = CURLE_OK;
  lVar2 = 0;
  do {
    if (lVar2 == 2) {
      return CVar1;
    }
    CVar1 = Curl_conn_cf_cntrl(conn->cfilter[lVar2],data,ignore_result,event,arg1,(void *)0x0);
    lVar2 = lVar2 + 1;
  } while ((ignore_result) || (CVar1 == CURLE_OK));
  return CVar1;
}

Assistant:

static CURLcode cf_cntrl_all(struct connectdata *conn,
                             struct Curl_easy *data,
                             bool ignore_result,
                             int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  size_t i;

  for(i = 0; i < ARRAYSIZE(conn->cfilter); ++i) {
    result = Curl_conn_cf_cntrl(conn->cfilter[i], data, ignore_result,
                                event, arg1, arg2);
    if(!ignore_result && result)
      break;
  }
  return result;
}